

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::Board(Board *this,BoardSize size,BoardMode mode)

{
  mapped_type *pmVar1;
  iterator __first;
  iterator __last;
  BoardSize local_14;
  BoardMode mode_local;
  BoardSize size_local;
  Board *this_local;
  
  this->size = size;
  local_14 = size;
  _mode_local = this;
  pmVar1 = std::
           map<BoardSize,_unsigned_long,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_unsigned_long>_>_>
           ::at(&Maps::boardSizeInt,&local_14);
  this->sizeInt = *pmVar1;
  this->mode = mode;
  this->nullValue = this->sizeInt * this->sizeInt - 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->values);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->values,this->sizeInt * this->sizeInt);
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->values);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->values);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__last._M_current,0);
  return;
}

Assistant:

Board::Board( BoardSize size, BoardMode mode ) : size( size ),
                                                 mode( mode ),
                                                 sizeInt( Maps::boardSizeInt.at( size )),
                                                 nullValue( sizeInt * sizeInt - 1 )
{
    values.resize( sizeInt * sizeInt );
    std::iota( values.begin(), values.end(), 0 );
}